

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
TransitionObservationIndependentMADPDiscrete::JointToIndividualActionIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          TransitionObservationIndependentMADPDiscrete *this,Index ja_e,Scope *agSC)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *indivIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_A_e;
  allocator_type local_39;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
             (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2,&local_39);
  indivIndices = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xf0))(this);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (indivIndices,agSC,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38);
  IndexTools::JointToIndividualIndices
            (__return_storage_ptr__,ja_e,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> JointToIndividualActionIndices(
        Index ja_e, const Scope& agSC) const
        { 
            // identical to MADPComponentDiscreteActions
            std::vector<size_t> nr_A_e(agSC.size());
            IndexTools::RestrictIndividualIndicesToScope(
                GetNrActions(), agSC, nr_A_e);
            std::vector<Index> ja_e_vec = IndexTools::JointToIndividualIndices(ja_e, nr_A_e);
            return(ja_e_vec);
        }